

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idefs.h
# Opt level: O3

bool __thiscall Am_Input_Char::operator!=(Am_Input_Char *this,Am_Input_Char i)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar2 = ((uint)i & 0xffff) == 0x103;
  bVar3 = this->code != 0x103;
  bVar1 = true;
  if ((bVar2 || bVar3) && (!bVar2 || !bVar3)) {
    bVar1 = helper_check_equal(this,i);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool operator==(Am_Input_Char i) const
  {
    //quick exit for mouse_moved == something else, for efficiency.
    // Mouse-moved doesn't match ANY-* so is an easy test
    if ((i.code == Am_MOUSE_MOVED && code != Am_MOUSE_MOVED) ||
        (code == Am_MOUSE_MOVED && i.code != Am_MOUSE_MOVED))
      return false;
    else
      return helper_check_equal(i);
  }